

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS.cpp
# Opt level: O0

void __thiscall adios2::core::ADIOS::GlobalServices::CheckStatus(GlobalServices *this)

{
  byte *in_RDI;
  allocator local_b1;
  string local_b0 [36];
  int in_stack_ffffffffffffff74;
  string *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  if ((*in_RDI & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"Core",&local_29);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"ADIOS::GlobalServices",&local_61);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff78,"CheckStatus",
               (allocator *)&stack0xffffffffffffff77);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_b0,
               "Global Services was already shutdown. Make sure there is one true global ADIOS object that is created first and destructed last to ensure Global services are initialized only once"
               ,&local_b1);
    helper::Throw<std::logic_error>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    std::__cxx11::string::~string(local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  return;
}

Assistant:

void CheckStatus()
    {
        if (wasGlobalShutdown)
        {
            helper::Throw<std::logic_error>(
                "Core", "ADIOS::GlobalServices", "CheckStatus",
                "Global Services was already shutdown. Make sure there is one "
                "true global ADIOS object that is created first and destructed "
                "last to ensure Global services are initialized only once");
        }
    }